

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ObjDeleteFaninIndex(Acb_Ntk_t *p,int iObj,int iFaninIndex)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  
  piVar1 = Acb_ObjFanins(p,iObj);
  iVar3 = *piVar1 + -1;
  *piVar1 = iVar3;
  for (lVar2 = (long)iFaninIndex; lVar2 < iVar3; lVar2 = lVar2 + 1) {
    piVar1[lVar2 + 1] = piVar1[lVar2 + 2];
    iVar3 = *piVar1;
  }
  piVar1[(long)iVar3 + 1] = -1;
  return;
}

Assistant:

static inline void Acb_ObjDeleteFaninIndex( Acb_Ntk_t * p, int iObj, int iFaninIndex )
{
    int i, * pFanins = Acb_ObjFanins( p, iObj );
    pFanins[0]--;
    for ( i = iFaninIndex; i < pFanins[0]; i++ )
        pFanins[ 1 + i ] = pFanins[ 2 + i ];
    pFanins[ 1 + pFanins[0] ] = -1;
}